

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubstitutionTree.hpp
# Opt level: O0

void __thiscall
Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::
FastGeneralizationsIterator::FastGeneralizationsIterator<Kernel::Literal*>
          (FastGeneralizationsIterator *this,
          SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs> *parent,Node *root,
          Literal *query,bool retrieveSubstitution,bool reversed)

{
  undefined8 in_RDX;
  Literal *in_RSI;
  SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs> *in_RDI;
  Renaming *in_stack_ffffffffffffff70;
  size_t in_stack_ffffffffffffff78;
  Node **initialCapacity;
  Stack<void_*> *this_00;
  undefined2 uVar1;
  Node *this_01;
  FastGeneralizationsIterator *this_02;
  
  this_01 = (Node *)&in_RDI->_root;
  SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::GenMatcher::
  GenMatcher<Kernel::Literal*>((GenMatcher *)this_01,in_RSI,(uint)((ulong)in_RDX >> 0x20));
  uVar1 = (undefined2)((ulong)in_RDX >> 0x30);
  this_02 = (FastGeneralizationsIterator *)&in_RDI[4]._root;
  Lib::VirtualIterator<Inferences::ALASCA::BinaryResolutionConf::Lhs_*>::VirtualIterator
            ((VirtualIterator<Inferences::ALASCA::BinaryResolutionConf::Lhs_*> *)this_02);
  Kernel::Renaming::Renaming(in_stack_ffffffffffffff70);
  this_00 = (Stack<void_*> *)(in_RDI + 7);
  Lib::Stack<void_*>::Stack(this_00,in_stack_ffffffffffffff78);
  initialCapacity = &in_RDI[8]._root;
  Lib::Stack<unsigned_int>::Stack((Stack<unsigned_int> *)this_00,(size_t)initialCapacity);
  Lib::
  Stack<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::NodeAlgorithm>::
  Stack((Stack<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::NodeAlgorithm>
         *)this_00,(size_t)initialCapacity);
  InstanceCntr::InstanceCntr((InstanceCntr *)(in_RDI + 0xb));
  init<Kernel::Literal*>(this_02,in_RDI,this_01,in_RSI,SUB21((ushort)uVar1 >> 8,0),SUB21(uVar1,0));
  return;
}

Assistant:

FastGeneralizationsIterator(SubstitutionTree* parent, Node* root, TermOrLit query, bool retrieveSubstitution, bool reversed)
      : _subst(query, parent->_nextVar)
      { init(parent, root, query, retrieveSubstitution, reversed); }